

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entity.c
# Opt level: O0

void run_component_trigger_for_entities
               (ecs_world_t *world,ecs_vector_t *trigger_vec,ecs_entity_t component,
               ecs_table_t *table,ecs_data_t *data,int32_t row,int32_t count,ecs_entity_t *entities)

{
  int32_t iVar1;
  int32_t iVar2;
  void *pvVar3;
  ecs_world_t *local_180;
  ecs_iter_t it;
  ecs_iter_table_t table_data;
  ecs_column_t *column;
  ecs_type_t peStack_60;
  int32_t columns [1];
  ecs_type_t types [1];
  ecs_entity_t components [1];
  int32_t index;
  EcsTrigger *triggers;
  int local_38;
  int32_t trigger_count;
  int32_t i;
  int32_t row_local;
  ecs_data_t *data_local;
  ecs_table_t *table_local;
  ecs_entity_t component_local;
  ecs_vector_t *trigger_vec_local;
  ecs_world_t *world_local;
  
  iVar1 = ecs_vector_count(trigger_vec);
  if (iVar1 != 0) {
    pvVar3 = _ecs_vector_first(trigger_vec,0x28,0x10);
    iVar2 = ecs_type_index_of(table->type,component);
    _ecs_assert(-1 < iVar2,0xc,(char *)0x0,"index >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                ,0xdb);
    if (iVar2 < 0) {
      __assert_fail("index >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                    ,0xdb,
                    "void run_component_trigger_for_entities(ecs_world_t *, ecs_vector_t *, ecs_entity_t, ecs_table_t *, ecs_data_t *, int32_t, int32_t, ecs_entity_t *)"
                   );
    }
    peStack_60 = ecs_type_from_entity(world,component);
    if (table->column_count < iVar2 + 1) {
      column._4_4_ = 0;
    }
    else {
      column._4_4_ = iVar2 + 1;
      if (data->columns[iVar2].size == 0) {
        column._4_4_ = 0;
      }
    }
    it.iter.parent.table.references = (ecs_ref_t *)((long)&column + 4);
    memset(&local_180,0,0xe0);
    it._24_8_ = (long)&it.iter + 0x50;
    it.query._0_4_ = 1;
    it.query._4_4_ = 1;
    it.table_count = 1;
    it._56_8_ = data->columns;
    it.table_columns = entities;
    it.frame_offset = count;
    local_180 = world;
    it.world_time = (float)row;
    for (local_38 = 0; local_38 < iVar1; local_38 = local_38 + 1) {
      it.real_world = *(ecs_world_t **)((long)pvVar3 + (long)local_38 * 0x28 + 0x18);
      it.entities = *(ecs_entity_t **)((long)pvVar3 + (long)local_38 * 0x28 + 0x20);
      (**(code **)((long)pvVar3 + (long)local_38 * 0x28 + 8))(&local_180);
    }
  }
  return;
}

Assistant:

static
void run_component_trigger_for_entities(
    ecs_world_t * world,
    ecs_vector_t * trigger_vec,
    ecs_entity_t component,
    ecs_table_t * table,
    ecs_data_t * data,
    int32_t row,
    int32_t count,
    ecs_entity_t *entities)
{    
    (void)world;
    int32_t i, trigger_count = ecs_vector_count(trigger_vec);
    if (trigger_count) {
        EcsTrigger *triggers = ecs_vector_first(trigger_vec, EcsTrigger);
        int32_t index = ecs_type_index_of(table->type, component);
        ecs_assert(index >= 0, ECS_INTERNAL_ERROR, NULL);
        index ++;

        ecs_entity_t components[1] = { component };
        ecs_type_t types[1] = { ecs_type_from_entity(world, component) };
        int32_t columns[1] = { index };

        /* If this is a tag, don't try to retrieve data */
        if (table->column_count < index) {
            columns[0] = 0;
        } else {
            ecs_column_t *column = &data->columns[index - 1];
            if (!column->size) {
                columns[0] = 0;
            }            
        }
        
        ecs_iter_table_t table_data = {
            .table = table,
            .columns = columns,
            .components = components,
            .types = types
        };

        ecs_iter_t it = {
            .world = world,
            .table = &table_data,
            .table_count = 1,
            .inactive_table_count = 1,
            .column_count = 1,
            .table_columns = data->columns,
            .entities = entities,
            .offset = row,
            .count = count,
        };

        for (i = 0; i < trigger_count; i ++) {
            it.system = triggers[i].self;
            it.param = triggers[i].ctx;
            triggers[i].action(&it);
        }
    }
}